

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperBase::UpdateEdgeIntoAEL(ClipperBase *this,TEdge **e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *pTVar3;
  TEdge *pTVar4;
  bool bVar5;
  clipperException *this_00;
  TEdge *AelNext;
  TEdge *AelPrev;
  TEdge **e_local;
  ClipperBase *this_local;
  
  if ((*e)->NextInLML == (TEdge *)0x0) {
    this_00 = (clipperException *)__cxa_allocate_exception(0x28);
    clipperException::clipperException(this_00,"UpdateEdgeIntoAEL: invalid call");
    __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
  }
  (*e)->NextInLML->OutIdx = (*e)->OutIdx;
  pTVar1 = (*e)->PrevInAEL;
  pTVar2 = (*e)->NextInAEL;
  if (pTVar1 == (TEdge *)0x0) {
    this->m_ActiveEdges = (*e)->NextInLML;
  }
  else {
    pTVar1->NextInAEL = (*e)->NextInLML;
  }
  if (pTVar2 != (TEdge *)0x0) {
    pTVar2->PrevInAEL = (*e)->NextInLML;
  }
  (*e)->NextInLML->Side = (*e)->Side;
  (*e)->NextInLML->WindDelta = (*e)->WindDelta;
  (*e)->NextInLML->WindCnt = (*e)->WindCnt;
  (*e)->NextInLML->WindCnt2 = (*e)->WindCnt2;
  *e = (*e)->NextInLML;
  pTVar3 = *e;
  pTVar4 = *e;
  (pTVar4->Curr).X = (pTVar3->Bot).X;
  (pTVar4->Curr).Y = (pTVar3->Bot).Y;
  (*e)->PrevInAEL = pTVar1;
  (*e)->NextInAEL = pTVar2;
  bVar5 = IsHorizontal(*e);
  if (!bVar5) {
    InsertScanbeam(this,((*e)->Top).Y);
  }
  return;
}

Assistant:

void ClipperBase::UpdateEdgeIntoAEL(TEdge *&e)
{
  if (!e->NextInLML) 
    throw clipperException("UpdateEdgeIntoAEL: invalid call");

  e->NextInLML->OutIdx = e->OutIdx;
  TEdge* AelPrev = e->PrevInAEL;
  TEdge* AelNext = e->NextInAEL;
  if (AelPrev) AelPrev->NextInAEL = e->NextInLML;
  else m_ActiveEdges = e->NextInLML;
  if (AelNext) AelNext->PrevInAEL = e->NextInLML;
  e->NextInLML->Side = e->Side;
  e->NextInLML->WindDelta = e->WindDelta;
  e->NextInLML->WindCnt = e->WindCnt;
  e->NextInLML->WindCnt2 = e->WindCnt2;
  e = e->NextInLML;
  e->Curr = e->Bot;
  e->PrevInAEL = AelPrev;
  e->NextInAEL = AelNext;
  if (!IsHorizontal(*e)) InsertScanbeam(e->Top.Y);
}